

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

int s2pred::TriageCompareLineCos2Distance<double>
              (Vector3<double> *x,Vector3<double> *a0,Vector3<double> *a1,double r2,
              Vector3<double> *n,double n1,double n2)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  uVar1 = 0xffffffff;
  if (r2 < 2.0) {
    dVar2 = r2 * -0.5 + 1.0;
    dVar2 = n2 * dVar2 * dVar2;
    dVar5 = x->c_[2] * n->c_[0] - n->c_[2] * x->c_[0];
    dVar3 = x->c_[0] * n->c_[1] - n->c_[0] * x->c_[1];
    dVar4 = x->c_[1] * n->c_[2] - n->c_[1] * x->c_[2];
    dVar3 = dVar3 * dVar3 + dVar4 * dVar4 + dVar5 * dVar5;
    dVar4 = (n1 * 5.618802153517007 + 6.153480596427404e-15) * 1.1102230246251565e-16;
    dVar4 = dVar2 * 8.881784197001252e-16 + dVar2 * 7.771561172376096e-16 +
            (SQRT(dVar3) + SQRT(dVar3) + dVar4) * dVar4 + dVar3 * 3.3306690738754696e-16;
    uVar1 = 0xffffffff;
    if (dVar3 - dVar2 <= dVar4) {
      uVar1 = (uint)(dVar3 - dVar2 < -dVar4);
    }
  }
  return uVar1;
}

Assistant:

int TriageCompareLineCos2Distance(const Vector3<T>& x, const Vector3<T>& a0,
                                  const Vector3<T>& a1, T r2,
                                  const Vector3<T>& n, T n1, T n2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // The minimum distance is to a point on the edge interior.  Since the true
  // distance to the edge is always less than 90 degrees, we can return
  // immediately if the limit is 90 degrees or larger.
  if (r2 >= 2.0) return -1;  // distance < limit

  // Otherwise we compute cos^2(distance to edge).
  T cos_r = 1 - 0.5 * r2;
  T n2cos2_r = n2 * cos_r * cos_r;
  T n2cos2_r_error = 7 * T_ERR * n2cos2_r;

  // The length of M = X.CrossProd(N) is the cosine of the distance.
  T m2 = x.CrossProd(n).Norm2();
  T m1 = sqrt(m2);
  T m1_error = ((1 + 8 / sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T m2_error = 3 * T_ERR * m2 + (2 * m1 + m1_error) * m1_error;

  // If we are using extended precision, then it is worthwhile to recompute
  // the length of X more accurately.  Otherwise we use the fact that X is
  // guaranteed to be unit length to within a tolerance of 4 * DBL_ERR.
  if (T_ERR < DBL_ERR) {
    n2cos2_r *= x.Norm2();
    n2cos2_r_error += 4 * T_ERR * n2cos2_r;
  } else {
    n2cos2_r_error += 8 * DBL_ERR * n2cos2_r;
  }
  T diff = m2 - n2cos2_r;
  T error = m2_error + n2cos2_r_error;
  return (diff > error) ? -1 : (diff < -error) ? 1 : 0;
}